

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float64_suite::fail_array8_float64_overflow(void)

{
  undefined4 local_5c;
  size_type local_58;
  array<double,_1UL> value;
  value_type input [18];
  decoder decoder;
  
  input[0] = 0xaf;
  input[1] = '\x10';
  input[2] = '\0';
  input[3] = '\0';
  input[4] = '\0';
  input[5] = '\0';
  input[6] = '\0';
  input[7] = '\0';
  input[8] = 0xf0;
  input[9] = '?';
  input[10] = '\0';
  input[0xb] = '\0';
  input[0xc] = '\0';
  input[0xd] = '\0';
  input[0xe] = '\0';
  input[0xf] = '\0';
  input[0x10] = 0xf0;
  input[0x11] = '?';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[18]>(&decoder,&input);
  value._M_elems[0] = (_Type)0.0;
  local_58 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float64>::decode
                       (&decoder,(return_type *)&value,1);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf5a,"void compact_float64_suite::fail_array8_float64_overflow()",&local_58,&local_5c
            );
  return;
}

Assistant:

void fail_array8_float64_overflow()
{
    const value_type input[] = { token::code::array8_float64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float64::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}